

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

bool filemgr_update_file_linkage(filemgr *file,char *old_filename,char *new_filename)

{
  uint32_t uVar1;
  uint64_t in_RDX;
  long in_RSI;
  char *in_RDI;
  char *unaff_retaddr;
  bool ret;
  undefined4 in_stack_ffffffffffffffd8;
  memory_order in_stack_ffffffffffffffdc;
  uint7 in_stack_ffffffffffffffe0;
  byte bVar2;
  int line;
  
  bVar2 = 1;
  pthread_spin_lock((pthread_spinlock_t *)(in_RDI + 0x1a0));
  if (in_RSI != 0) {
    if (*(long *)(in_RDI + 0x118) == 0) {
      assign_old_filename((filemgr *)CONCAT17(bVar2,in_stack_ffffffffffffffe0),
                          (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    }
    else {
      bVar2 = 0;
      uVar1 = atomic_get_uint32_t((atomic<unsigned_int> *)(ulong)in_stack_ffffffffffffffe0,
                                  in_stack_ffffffffffffffdc);
      line = (int)((ulong)in_RSI >> 0x20);
      if (uVar1 == 0) {
        atomic_get_uint32_t((atomic<unsigned_int> *)CONCAT17(bVar2,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffdc);
        fdb_assert_die(unaff_retaddr,in_RDI,line,in_RDX,CONCAT17(bVar2,in_stack_ffffffffffffffe0));
      }
    }
  }
  if (in_RDX != 0) {
    assign_new_filename((filemgr *)CONCAT17(bVar2,in_stack_ffffffffffffffe0),
                        (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  pthread_spin_unlock((pthread_spinlock_t *)(in_RDI + 0x1a0));
  return (bool)(bVar2 & 1);
}

Assistant:

bool filemgr_update_file_linkage(struct filemgr *file,
                                 const char *old_filename,
                                 const char *new_filename)
{

    bool ret = true;
    spin_lock(&file->lock);
    if (old_filename) {
        if (!file->old_filename) {
            assign_old_filename(file, old_filename);
        } else {
            ret = false;
            fdb_assert(atomic_get_uint32_t(&file->ref_count),
                       atomic_get_uint32_t(&file->ref_count), 0);
        }
    }
    if (new_filename) {
        assign_new_filename(file, new_filename);
    }
    spin_unlock(&file->lock);
    return ret;
}